

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O3

M44d * Imath_3_2::procrustesRotationAndTranslation<float>
                 (M44d *__return_storage_ptr__,Vec3<float> *A,Vec3<float> *B,float *weights,
                 size_t numPoints,bool doScale)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  long lVar10;
  double *pdVar11;
  size_t sVar12;
  double *pdVar13;
  long lVar14;
  double (*A_00) [3];
  float *pfVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  double dVar18;
  undefined1 auVar19 [16];
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar29;
  double dVar30;
  undefined1 auVar28 [16];
  double dVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  double dVar34;
  double dVar35;
  M33d Qt;
  V3d S;
  M33d U;
  M33d C;
  M33d V;
  double local_178;
  double dStack_170;
  double local_168;
  undefined1 local_160 [16];
  double local_150;
  double local_148;
  double dStack_140;
  double local_138;
  Vec3<double> local_130;
  Matrix33<double> local_118;
  double local_c8;
  double dStack_c0;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  double local_98;
  double dStack_90;
  double local_88;
  Matrix33<double> local_78;
  
  if (numPoints == 0) {
    __return_storage_ptr__->x[0][0] = 1.0;
    __return_storage_ptr__->x[0][1] = 0.0;
    __return_storage_ptr__->x[0][2] = 0.0;
    __return_storage_ptr__->x[0][3] = 0.0;
    __return_storage_ptr__->x[1][0] = 0.0;
    __return_storage_ptr__->x[1][1] = 1.0;
    __return_storage_ptr__->x[1][2] = 0.0;
    __return_storage_ptr__->x[1][3] = 0.0;
    __return_storage_ptr__->x[2][0] = 0.0;
    __return_storage_ptr__->x[2][1] = 0.0;
    __return_storage_ptr__->x[2][2] = 1.0;
    __return_storage_ptr__->x[2][3] = 0.0;
    __return_storage_ptr__->x[3][0] = 0.0;
    __return_storage_ptr__->x[3][1] = 0.0;
    __return_storage_ptr__->x[3][2] = 0.0;
    __return_storage_ptr__->x[3][3] = 1.0;
  }
  else {
    auVar28 = ZEXT816(0);
    if (weights == (float *)0x0) {
      lVar10 = 8;
      auVar33 = ZEXT816(0);
      auVar32 = ZEXT816(0);
      sVar12 = numPoints;
      do {
        uVar1 = *(undefined8 *)((long)A + lVar10 + -8);
        dVar30 = auVar33._8_8_;
        auVar33._0_8_ = auVar33._0_8_ + (double)(float)uVar1;
        auVar33._8_8_ = dVar30 + (double)(float)((ulong)uVar1 >> 0x20);
        uVar1 = *(undefined8 *)((long)B + lVar10 + -8);
        dVar30 = auVar28._8_8_;
        auVar28._0_8_ = auVar28._0_8_ + (double)(float)uVar1;
        auVar28._8_8_ = dVar30 + (double)(float)((ulong)uVar1 >> 0x20);
        dVar30 = auVar32._8_8_;
        auVar32._0_8_ = auVar32._0_8_ + (double)*(float *)((long)&B->x + lVar10);
        auVar32._8_8_ = dVar30 + (double)*(float *)((long)&A->x + lVar10);
        lVar10 = lVar10 + 0xc;
        sVar12 = sVar12 - 1;
      } while (sVar12 != 0);
      auVar19._8_4_ = (int)(numPoints >> 0x20);
      auVar19._0_8_ = numPoints;
      auVar19._12_4_ = 0x45300000;
      dVar30 = (auVar19._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)numPoints) - 4503599627370496.0);
    }
    else {
      dVar30 = 0.0;
      lVar10 = 2;
      sVar12 = 0;
      auVar33 = ZEXT816(0);
      auVar32 = ZEXT816(0);
      do {
        dVar18 = (double)weights[sVar12];
        dVar30 = dVar30 + dVar18;
        uVar1 = *(undefined8 *)((long)A + lVar10 * 4 + -8);
        dVar29 = auVar33._8_8_;
        auVar33._0_8_ = auVar33._0_8_ + (double)(float)uVar1 * dVar18;
        auVar33._8_8_ = dVar29 + (double)(float)((ulong)uVar1 >> 0x20) * dVar18;
        uVar1 = *(undefined8 *)((long)B + lVar10 * 4 + -8);
        dVar29 = auVar28._8_8_;
        auVar28._0_8_ = auVar28._0_8_ + (double)(float)uVar1 * dVar18;
        auVar28._8_8_ = dVar29 + (double)(float)((ulong)uVar1 >> 0x20) * dVar18;
        dVar29 = auVar32._8_8_;
        auVar32._0_8_ = auVar32._0_8_ + (double)(&B->x)[lVar10] * dVar18;
        auVar32._8_8_ = dVar29 + (double)(&A->x)[lVar10] * dVar18;
        sVar12 = sVar12 + 1;
        lVar10 = lVar10 + 3;
      } while (numPoints != sVar12);
    }
    uVar17 = (undefined4)((ulong)dVar30 >> 0x20);
    uVar16 = SUB84(dVar30,0);
    if ((dVar30 != 0.0) || (NAN(dVar30))) {
      auVar2._8_4_ = uVar16;
      auVar2._0_8_ = dVar30;
      auVar2._12_4_ = uVar17;
      auVar33 = divpd(auVar33,auVar2);
      auVar3._8_4_ = uVar16;
      auVar3._0_8_ = dVar30;
      auVar3._12_4_ = uVar17;
      auVar28 = divpd(auVar28,auVar3);
      auVar4._8_4_ = uVar16;
      auVar4._0_8_ = dVar30;
      auVar4._12_4_ = uVar17;
      auVar32 = divpd(auVar32,auVar4);
      dVar35 = auVar32._8_8_;
      local_c8 = 0.0;
      dStack_c0 = 0.0;
      local_88 = 0.0;
      dVar31 = auVar32._0_8_;
      dVar34 = auVar33._0_8_;
      dVar18 = auVar33._8_8_;
      dVar29 = auVar28._0_8_;
      dVar30 = auVar28._8_8_;
      if (weights == (float *)0x0) {
        lVar10 = 8;
        dVar6 = 0.0;
        dVar7 = 0.0;
        dVar24 = 0.0;
        dVar23 = 0.0;
        local_98 = 0.0;
        dStack_90 = 0.0;
        sVar12 = numPoints;
        local_88 = 0.0;
        do {
          uVar1 = *(undefined8 *)((long)A + lVar10 + -8);
          dVar22 = (double)*(float *)((long)&B->x + lVar10) - dVar31;
          dVar26 = (double)*(float *)((long)&A->x + lVar10) - dVar35;
          dVar20 = (double)(float)uVar1 - dVar34;
          dVar21 = (double)(float)((ulong)uVar1 >> 0x20) - dVar18;
          uVar1 = *(undefined8 *)((long)B + lVar10 + -8);
          dVar27 = (double)(float)uVar1 - dVar29;
          dVar25 = (double)(float)((ulong)uVar1 >> 0x20) - dVar30;
          local_c8 = local_c8 + dVar27 * dVar20;
          dStack_c0 = dStack_c0 + dVar27 * dVar21;
          dVar6 = dVar6 + dVar26 * dVar27;
          dVar7 = dVar7 + dVar20 * dVar25;
          dVar24 = dVar24 + dVar21 * dVar25;
          dVar23 = dVar23 + dVar26 * dVar25;
          local_98 = local_98 + dVar22 * dVar20;
          dStack_90 = dStack_90 + dVar22 * dVar21;
          local_88 = local_88 + dVar26 * dVar22;
          lVar10 = lVar10 + 0xc;
          sVar12 = sVar12 - 1;
        } while (sVar12 != 0);
      }
      else {
        lVar10 = 2;
        sVar12 = 0;
        dVar6 = 0.0;
        dVar7 = 0.0;
        dVar24 = 0.0;
        dVar23 = 0.0;
        local_98 = 0.0;
        dStack_90 = 0.0;
        do {
          dVar27 = (double)weights[sVar12];
          dVar20 = ((double)(&B->x)[lVar10] - dVar31) * dVar27;
          dVar21 = (double)(&A->x)[lVar10] - dVar35;
          uVar1 = *(undefined8 *)((long)A + lVar10 * 4 + -8);
          dVar22 = (double)(float)uVar1 - dVar34;
          dVar26 = (double)(float)((ulong)uVar1 >> 0x20) - dVar18;
          uVar1 = *(undefined8 *)((long)B + lVar10 * 4 + -8);
          dVar25 = dVar27 * ((double)(float)uVar1 - dVar29);
          dVar27 = dVar27 * ((double)(float)((ulong)uVar1 >> 0x20) - dVar30);
          local_c8 = local_c8 + dVar25 * dVar22;
          dStack_c0 = dStack_c0 + dVar25 * dVar26;
          dVar6 = dVar6 + dVar21 * dVar25;
          dVar7 = dVar7 + dVar22 * dVar27;
          dVar24 = dVar24 + dVar26 * dVar27;
          dVar23 = dVar23 + dVar21 * dVar27;
          local_98 = local_98 + dVar20 * dVar22;
          dStack_90 = dStack_90 + dVar20 * dVar26;
          local_88 = local_88 + dVar21 * dVar20;
          sVar12 = sVar12 + 1;
          lVar10 = lVar10 + 3;
        } while (numPoints != sVar12);
      }
      A_00 = (double (*) [3])&local_c8;
      local_b8._8_4_ = SUB84(dVar7,0);
      local_b8._0_8_ = dVar6;
      local_b8._12_4_ = (int)((ulong)dVar7 >> 0x20);
      local_a8._8_4_ = SUB84(dVar23,0);
      local_a8._0_8_ = dVar24;
      local_a8._12_4_ = (int)((ulong)dVar23 >> 0x20);
      local_118.x[0][0] = 1.0;
      local_118.x[0][1] = 0.0;
      local_118.x[0][2] = 0.0;
      local_118.x[1][0] = 0.0;
      local_118.x[1][1] = 1.0;
      local_118.x[1][2] = 0.0;
      local_118.x[2][0] = 0.0;
      local_118.x[2][1] = 0.0;
      local_118.x[2][2] = 1.0;
      local_78.x[0][0] = 1.0;
      local_78.x[0][1] = 0.0;
      local_78.x[0][2] = 0.0;
      local_78.x[1][0] = 0.0;
      local_78.x[1][1] = 1.0;
      local_78.x[1][2] = 0.0;
      local_78.x[2][0] = 0.0;
      local_78.x[2][1] = 0.0;
      local_78.x[2][2] = 1.0;
      jacobiSVD<double>((Matrix33<double> *)A_00,&local_118,&local_130,&local_78,
                        2.220446049250313e-16,true);
      local_178 = local_78.x[0][2] * local_118.x[0][2] +
                  local_78.x[0][0] * local_118.x[0][0] + local_78.x[0][1] * local_118.x[0][1];
      dStack_170 = local_78.x[0][2] * local_118.x[1][2] +
                   local_78.x[0][0] * local_118.x[1][0] + local_78.x[0][1] * local_118.x[1][1];
      local_168 = local_78.x[0][2] * local_118.x[2][2] +
                  local_78.x[0][0] * local_118.x[2][0] + local_118.x[2][1] * local_78.x[0][1];
      dVar6 = local_78.x[1][2] * local_118.x[0][2] +
              local_78.x[1][0] * local_118.x[0][0] + local_78.x[1][1] * local_118.x[0][1];
      dVar7 = local_78.x[1][2] * local_118.x[1][2] +
              local_78.x[1][0] * local_118.x[1][0] + local_78.x[1][1] * local_118.x[1][1];
      local_160._8_4_ = SUB84(dVar7,0);
      local_160._0_8_ = dVar6;
      local_160._12_4_ = (int)((ulong)dVar7 >> 0x20);
      local_150 = local_78.x[1][2] * local_118.x[2][2] +
                  local_78.x[1][0] * local_118.x[2][0] + local_118.x[2][1] * local_78.x[1][1];
      local_148 = local_78.x[2][2] * local_118.x[0][2] +
                  local_78.x[2][0] * local_118.x[0][0] + local_78.x[2][1] * local_118.x[0][1];
      dStack_140 = local_78.x[2][2] * local_118.x[1][2] +
                   local_78.x[2][0] * local_118.x[1][0] + local_78.x[2][1] * local_118.x[1][1];
      local_138 = local_78.x[2][2] * local_118.x[2][2] +
                  local_78.x[2][0] * local_118.x[2][0] + local_118.x[2][1] * local_78.x[2][1];
      if (doScale && numPoints != 1) {
        if (weights == (float *)0x0) {
          pfVar15 = &A->z;
          dVar23 = 0.0;
          dVar24 = 0.0;
          do {
            dVar27 = (double)((Vec3<float> *)(pfVar15 + -2))->x - dVar34;
            dVar23 = (((double)*pfVar15 - dVar35) * ((double)*pfVar15 - dVar35) +
                     dVar27 * dVar27 +
                     ((double)pfVar15[-1] - dVar18) * ((double)pfVar15[-1] - dVar18)) - dVar23;
            dVar27 = dVar24 + dVar23;
            dVar23 = (dVar27 - dVar24) - dVar23;
            pfVar15 = pfVar15 + 3;
            numPoints = numPoints - 1;
            dVar24 = dVar27;
          } while (numPoints != 0);
        }
        else {
          pfVar15 = &A->z;
          sVar12 = 0;
          dVar23 = 0.0;
          dVar24 = 0.0;
          do {
            dVar27 = (double)((Vec3<float> *)(pfVar15 + -2))->x - dVar34;
            dVar23 = (((double)*pfVar15 - dVar35) * ((double)*pfVar15 - dVar35) +
                     dVar27 * dVar27 +
                     ((double)pfVar15[-1] - dVar18) * ((double)pfVar15[-1] - dVar18)) *
                     (double)weights[sVar12] - dVar23;
            dVar27 = dVar24 + dVar23;
            dVar23 = (dVar27 - dVar24) - dVar23;
            sVar12 = sVar12 + 1;
            pfVar15 = pfVar15 + 3;
            dVar24 = dVar27;
          } while (numPoints != sVar12);
        }
        dVar24 = 0.0;
        pdVar11 = &local_178;
        lVar10 = 0;
        dVar23 = 0.0;
        do {
          lVar14 = 0;
          pdVar13 = pdVar11;
          dVar25 = dVar24;
          do {
            dVar23 = *pdVar13 * (*(double (*) [3])*A_00)[lVar14] - dVar23;
            dVar24 = dVar25 + dVar23;
            dVar23 = (dVar24 - dVar25) - dVar23;
            lVar14 = lVar14 + 1;
            pdVar13 = pdVar13 + 3;
            dVar25 = dVar24;
          } while (lVar14 != 3);
          lVar10 = lVar10 + 1;
          A_00 = A_00 + 1;
          pdVar11 = pdVar11 + 1;
        } while (lVar10 != 3);
        dVar24 = dVar24 / dVar27;
      }
      else {
        dVar24 = 1.0;
      }
      dVar34 = dVar34 * dVar24;
      dVar18 = dVar18 * dVar24;
      dVar35 = dVar35 * dVar24;
      __return_storage_ptr__->x[0][0] = local_178 * dVar24;
      __return_storage_ptr__->x[0][1] = dStack_170 * dVar24;
      __return_storage_ptr__->x[0][2] = local_168 * dVar24;
      __return_storage_ptr__->x[0][3] = 0.0;
      auVar9._8_4_ = SUB84(dVar7 * dVar24,0);
      auVar9._0_8_ = dVar6 * dVar24;
      auVar9._12_4_ = (int)((ulong)(dVar7 * dVar24) >> 0x20);
      *(undefined1 (*) [16])__return_storage_ptr__->x[1] = auVar9;
      __return_storage_ptr__->x[1][2] = local_150 * dVar24;
      __return_storage_ptr__->x[1][3] = 0.0;
      auVar8._8_4_ = SUB84(dVar24 * dStack_140,0);
      auVar8._0_8_ = dVar24 * local_148;
      auVar8._12_4_ = (int)((ulong)(dVar24 * dStack_140) >> 0x20);
      *(undefined1 (*) [16])__return_storage_ptr__->x[2] = auVar8;
      __return_storage_ptr__->x[2][2] = local_138 * dVar24;
      __return_storage_ptr__->x[2][3] = 0.0;
      dVar30 = dVar30 - (dVar35 * dStack_140 + dVar34 * dStack_170 + dVar18 * dVar7);
      auVar5._8_4_ = SUB84(dVar30,0);
      auVar5._0_8_ = dVar29 - (dVar35 * local_148 + dVar34 * local_178 + dVar18 * dVar6);
      auVar5._12_4_ = (int)((ulong)dVar30 >> 0x20);
      *(undefined1 (*) [16])__return_storage_ptr__->x[3] = auVar5;
      __return_storage_ptr__->x[3][2] =
           dVar31 - (dVar35 * local_138 + dVar34 * local_168 + local_150 * dVar18);
    }
    else {
      __return_storage_ptr__->x[0][0] = 1.0;
      __return_storage_ptr__->x[0][1] = 0.0;
      __return_storage_ptr__->x[0][2] = 0.0;
      __return_storage_ptr__->x[0][3] = 0.0;
      __return_storage_ptr__->x[1][0] = 0.0;
      __return_storage_ptr__->x[1][1] = 1.0;
      __return_storage_ptr__->x[1][2] = 0.0;
      __return_storage_ptr__->x[1][3] = 0.0;
      __return_storage_ptr__->x[2][0] = 0.0;
      __return_storage_ptr__->x[2][1] = 0.0;
      __return_storage_ptr__->x[2][2] = 1.0;
      __return_storage_ptr__->x[2][3] = 0.0;
      __return_storage_ptr__->x[3][0] = 0.0;
      __return_storage_ptr__->x[3][1] = 0.0;
      __return_storage_ptr__->x[3][2] = 0.0;
    }
    __return_storage_ptr__->x[3][3] = 1.0;
  }
  return __return_storage_ptr__;
}

Assistant:

M44d
procrustesRotationAndTranslation (
    const Vec3<T>* A,
    const Vec3<T>* B,
    const T*       weights,
    const size_t   numPoints,
    const bool     doScale)
{
    if (numPoints == 0) return M44d ();

    // Always do the accumulation in double precision:
    V3d    Acenter (0.0);
    V3d    Bcenter (0.0);
    double weightsSum = 0.0;

    if (weights == 0)
    {
        for (size_t i = 0; i < numPoints; ++i)
        {
            Acenter += (V3d) A[i];
            Bcenter += (V3d) B[i];
        }
        weightsSum = (double) numPoints;
    }
    else
    {
        for (size_t i = 0; i < numPoints; ++i)
        {
            const double w = weights[i];
            weightsSum += w;

            Acenter += w * (V3d) A[i];
            Bcenter += w * (V3d) B[i];
        }
    }

    if (weightsSum == 0) return M44d ();

    Acenter /= weightsSum;
    Bcenter /= weightsSum;

    //
    // Find Q such that |Q*A - B|  (actually A-Acenter and B-Bcenter, weighted)
    // is minimized in the least squares sense.
    // From Golub/Van Loan, p.601
    //
    // A,B are 3xn
    // Let C = B A^T   (where A is 3xn and B^T is nx3, so C is 3x3)
    // Compute the SVD: C = U D V^T  (U,V rotations, D diagonal).
    // Throw away the D part, and return Q = U V^T
    M33d C (0.0);
    if (weights == 0)
    {
        for (size_t i = 0; i < numPoints; ++i)
            C += outerProduct ((V3d) B[i] - Bcenter, (V3d) A[i] - Acenter);
    }
    else
    {
        for (size_t i = 0; i < numPoints; ++i)
        {
            const double w = weights[i];
            C +=
                outerProduct (w * ((V3d) B[i] - Bcenter), (V3d) A[i] - Acenter);
        }
    }

    M33d U, V;
    V3d  S;
    jacobiSVD (C, U, S, V, std::numeric_limits<double>::epsilon (), true);

    // We want Q.transposed() here since we are going to be using it in the
    // Imath style (multiplying vectors on the right, v' = v*A^T):
    const M33d Qt = V * U.transposed ();

    double s = 1.0;
    if (doScale && numPoints > 1)
    {
        // Finding a uniform scale: let us assume the Q is completely fixed
        // at this point (solving for both simultaneously seems much harder).
        // We are trying to compute (again, per Golub and van Loan)
        //    min || s*A*Q - B ||_F
        // Notice that we've jammed a uniform scale in front of the Q.
        // Now, the Frobenius norm (the least squares norm over matrices)
        // has the neat property that it is equivalent to minimizing the trace
        // of M^T*M (see your friendly neighborhood linear algebra text for a
        // derivation).  Thus, we can expand this out as
        //   min tr (s*A*Q - B)^T*(s*A*Q - B)
        // = min tr(Q^T*A^T*s*s*A*Q) + tr(B^T*B) - 2*tr(Q^T*A^T*s*B)  by linearity of the trace
        // = min s^2 tr(A^T*A) + tr(B^T*B) - 2*s*tr(Q^T*A^T*B)        using the fact that the trace is invariant
        //                                                            under similarity transforms Q*M*Q^T
        // If we differentiate w.r.t. s and set this to 0, we get
        // 0 = 2*s*tr(A^T*A) - 2*tr(Q^T*A^T*B)
        // so
        // 2*s*tr(A^T*A) = 2*s*tr(Q^T*A^T*B)
        // s = tr(Q^T*A^T*B) / tr(A^T*A)

        KahanSum traceATA;
        if (weights == 0)
        {
            for (size_t i = 0; i < numPoints; ++i)
                traceATA += ((V3d) A[i] - Acenter).length2 ();
        }
        else
        {
            for (size_t i = 0; i < numPoints; ++i)
                traceATA +=
                    ((double) weights[i]) * ((V3d) A[i] - Acenter).length2 ();
        }

        KahanSum traceBATQ;
        for (int i = 0; i < 3; ++i)
            for (int j = 0; j < 3; ++j)
                traceBATQ += Qt[j][i] * C[i][j];

        s = traceBATQ.get () / traceATA.get ();
    }

    // Q is the rotation part of what we want to return.
    // The entire transform is:
    //    (translate origin to Bcenter) * Q * (translate Acenter to origin)
    //                last                                first
    // The effect of this on a point is:
    //    (translate origin to Bcenter) * Q * (translate Acenter to origin) * point
    //  = (translate origin to Bcenter) * Q * (-Acenter + point)
    //  = (translate origin to Bcenter) * (-Q*Acenter + Q*point)
    //  = (translate origin to Bcenter) * (translate Q*Acenter to origin) * Q*point
    //  = (translate Q*Acenter to Bcenter) * Q*point
    // So what we want to return is:
    //    (translate Q*Acenter to Bcenter) * Q
    //
    // In block form, this is:
    //   [ 1 0 0  | ] [       0 ] [ 1 0 0  |  ]   [ 1 0 0  | ] [           |   ]   [                 ]
    //   [ 0 1 0 tb ] [  s*Q  0 ] [ 0 1 0 -ta ] = [ 0 1 0 tb ] [  s*Q  -s*Q*ta ] = [   Q   tb-s*Q*ta ]
    //   [ 0 0 1  | ] [       0 ] [ 0 0 1  |  ]   [ 0 0 1  | ] [           |   ]   [                 ]
    //   [ 0 0 0  1 ] [ 0 0 0 1 ] [ 0 0 0  1  ]   [ 0 0 0  1 ] [ 0 0 0     1   ]   [ 0 0 0    1      ]
    // (ofc the whole thing is transposed for Imath).
    const V3d translate = Bcenter - s * Acenter * Qt;

    return M44d (
        s * Qt.x[0][0],
        s * Qt.x[0][1],
        s * Qt.x[0][2],
        T (0),
        s * Qt.x[1][0],
        s * Qt.x[1][1],
        s * Qt.x[1][2],
        T (0),
        s * Qt.x[2][0],
        s * Qt.x[2][1],
        s * Qt.x[2][2],
        T (0),
        translate.x,
        translate.y,
        translate.z,
        T (1));
}